

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O2

void liu::get_input_label(string *filename,Mat *input,Mat *label,int sample_num,int start)

{
  Mat input_;
  FileStorage fs;
  Mat target_;
  FileNode local_1a0 [96];
  int local_140 [3];
  undefined4 local_134;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120 [80];
  FileStorage local_d0 [64];
  Mat local_90 [8];
  undefined4 local_88;
  
  cv::FileStorage::FileStorage(local_d0);
  local_130 = local_120;
  local_128 = 0;
  local_120[0] = 0;
  cv::FileStorage::open((string *)local_d0,(int)filename,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_130);
  cv::Mat::Mat((Mat *)&local_130);
  cv::Mat::Mat(local_90);
  cv::FileStorage::operator[]((char *)local_1a0);
  cv::operator>>(local_1a0,(Mat *)&local_130);
  cv::FileStorage::operator[]((char *)local_1a0);
  cv::operator>>(local_1a0,local_90);
  cv::FileStorage::release();
  local_140[1] = 0;
  local_134 = (undefined4)local_128;
  local_140[0] = start;
  local_140[2] = sample_num;
  cv::Mat::Mat((Mat *)local_1a0,(Mat *)&local_130,(Rect_ *)local_140);
  cv::Mat::operator=(input,(Mat *)local_1a0);
  cv::Mat::~Mat((Mat *)local_1a0);
  local_140[1] = 0;
  local_134 = local_88;
  local_140[0] = start;
  local_140[2] = sample_num;
  cv::Mat::Mat((Mat *)local_1a0,local_90,(Rect_ *)local_140);
  cv::Mat::operator=(label,(Mat *)local_1a0);
  cv::Mat::~Mat((Mat *)local_1a0);
  cv::Mat::~Mat(local_90);
  cv::Mat::~Mat((Mat *)&local_130);
  cv::FileStorage::~FileStorage(local_d0);
  return;
}

Assistant:

void get_input_label(std::string filename, cv::Mat& input, cv::Mat& label, int sample_num, int start)
	{
		cv::FileStorage fs;
		fs.open(filename, cv::FileStorage::READ);
		cv::Mat input_, target_;
		fs["input"] >> input_;
		fs["target"] >> target_;
		fs.release();
		input = input_(cv::Rect(start, 0, sample_num, input_.rows));
		label = target_(cv::Rect(start, 0, sample_num, target_.rows));
	}